

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeIf
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  If *iff;
  
  iff = MixedArena::alloc<wasm::If>(&this->wasm->allocator);
  (iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id =
       sig.results.id.id;
  visitIfStart(__return_storage_ptr__,this,iff,label,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeIf(Name label, Signature sig) {
  auto* iff = wasm.allocator.alloc<If>();
  iff->type = sig.results;
  return visitIfStart(iff, label, sig.params);
}